

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-player.c
# Opt level: O0

wchar_t project_player_handler_ICE(project_player_handler_context_t *context)

{
  player *ppVar1;
  _Bool _Var2;
  wchar_t v;
  uint32_t uVar3;
  wchar_t local_1c;
  project_player_handler_context_t *context_local;
  
  _Var2 = player_is_immune(player,L'\x03');
  if (!_Var2) {
    if (context->dam * 5 < 0x12d) {
      local_1c = context->dam * 5;
    }
    else {
      local_1c = L'Ĭ';
    }
    inven_damage(player,L'\x03',local_1c);
  }
  _Var2 = player_resists(player,L'\b');
  ppVar1 = player;
  if (_Var2) {
    msg("You resist the effect!");
  }
  else {
    v = damroll(5,8);
    player_inc_timed(ppVar1,L'\b',v,true,true,false);
  }
  ppVar1 = player;
  uVar3 = Rand_div(0xf);
  player_inc_timed(ppVar1,L'\t',uVar3 + L'\x01',true,true,true);
  return L'\0';
}

Assistant:

static int project_player_handler_ICE(project_player_handler_context_t *context)
{
	if (!player_is_immune(player, ELEM_COLD))
		inven_damage(player, PROJ_COLD, MIN(context->dam * 5, 300));

	/* Cuts */
	if (!player_resists(player, ELEM_SHARD)) {
		(void)player_inc_timed(player, TMD_CUT, damroll(5, 8), true,
			true, false);
	} else {
		msg("You resist the effect!");
	}

	/* Stun */
	(void)player_inc_timed(player, TMD_STUN, randint1(15), true, true,
		true);
	return 0;
}